

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# var_based_part.c
# Opt level: O0

void evaluate_neighbour_mvs
               (AV1_COMP *cpi,MACROBLOCK *x,uint *y_sad,_Bool is_small_sb,int est_motion)

{
  int iVar1;
  MV MVar2;
  uint8_t *puVar3;
  byte in_CL;
  int iVar4;
  uint *in_RDX;
  long in_RSI;
  long *in_RDI;
  int in_R8D;
  uint8_t *ref_buf_1;
  MV temp_1;
  MB_MODE_INFO *left_mbmi;
  uint8_t *ref_buf;
  MV temp;
  MB_MODE_INFO *above_mbmi;
  int multi;
  FULLPEL_MV best_mv;
  MV dummy_mv;
  SubpelMvLimits subpel_mv_limits;
  FULLPEL_MV left_mv;
  FULLPEL_MV above_mv;
  uint left_y_sad;
  uint above_y_sad;
  MB_MODE_INFO *mi;
  BLOCK_SIZE bsize;
  MACROBLOCKD *xd;
  int source_sad_nonrd;
  SubpelMvLimits *in_stack_ffffffffffffff08;
  buf_2d *in_stack_ffffffffffffff10;
  MV *pMVar5;
  MV local_c4;
  long local_c0;
  uint8_t *local_b8;
  FULLPEL_MV local_b0;
  MV local_ac;
  long local_a8;
  int local_9c;
  FULLPEL_MV local_98;
  MV local_94;
  SubpelMvLimits local_90;
  FULLPEL_MV local_80;
  FULLPEL_MV local_7c;
  uint local_78;
  uint local_74;
  MV *local_70;
  byte local_61;
  long local_60;
  int local_54;
  int local_50;
  byte local_49;
  uint *local_48;
  long local_40;
  long *local_38;
  FULLPEL_MV *local_30;
  FULLPEL_MV *local_28;
  FULLPEL_MV *local_20;
  FULLPEL_MV *local_18;
  FULLPEL_MV *local_10;
  FULLPEL_MV *local_8;
  
  local_49 = in_CL & 1;
  local_54 = *(int *)(in_RSI + 0x15d60);
  if ((in_R8D < 3) || (local_54 < 4)) {
    local_60 = in_RSI + 0x1a0;
    local_61 = 0xf;
    if (local_49 != 0) {
      local_61 = 0xc;
    }
    local_70 = (MV *)**(undefined8 **)(in_RSI + 0x2058);
    local_74 = 0xffffffff;
    local_78 = 0xffffffff;
    local_50 = in_R8D;
    local_48 = in_RDX;
    local_40 = in_RSI;
    local_38 = in_RDI;
    memset(&local_7c,0,4);
    memset(&local_80,0,4);
    memset(&local_94,0,4);
    av1_set_subpel_mv_search_range(&local_90,(FullMvLimits *)(local_40 + 0x1f6e4),&local_94);
    local_98 = get_fullmv_from_mv(local_70 + 2);
    local_9c = 8;
    if (2 < local_50 && 2 < local_54) {
      local_9c = 7;
    }
    if ((((*(byte *)(local_60 + 0x1ec0) & 1) != 0) &&
        (local_a8 = *(long *)(local_60 + 0x1ed0), 0xc < *(byte *)(local_a8 + 2))) &&
       (*(char *)(local_a8 + 0x10) == '\x01')) {
      local_ac = *(MV *)(local_a8 + 8);
      clamp_mv((MV *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
      local_b0 = get_fullmv_from_mv(&local_ac);
      local_8 = &local_98;
      local_10 = &local_7c;
      local_7c.row = local_b0.row;
      iVar1 = (int)local_98.row - (int)local_7c.row;
      if (iVar1 < 1) {
        iVar1 = -iVar1;
      }
      local_7c.col = local_b0.col;
      iVar4 = (int)local_98.col - (int)local_7c.col;
      if (iVar4 < 1) {
        iVar4 = -iVar4;
      }
      local_7c = local_b0;
      if (0 < iVar1 + iVar4) {
        local_b8 = get_buf_from_fullmv(in_stack_ffffffffffffff10,
                                       (FULLPEL_MV *)in_stack_ffffffffffffff08);
        local_74 = (**(code **)(*local_38 + 0xc900 + (ulong)local_61 * 0x70))
                             (*(undefined8 *)(local_40 + 0x30),*(undefined4 *)(local_40 + 0x48),
                              local_b8,*(undefined4 *)(local_60 + 0x58));
      }
    }
    if ((((*(byte *)(local_60 + 0x1ec1) & 1) != 0) &&
        (local_c0 = *(long *)(local_60 + 0x1ec8), 0xc < *(byte *)(local_c0 + 2))) &&
       (*(char *)(local_c0 + 0x10) == '\x01')) {
      local_c4 = *(MV *)(local_c0 + 8);
      clamp_mv((MV *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
      local_80 = get_fullmv_from_mv(&local_c4);
      local_18 = &local_98;
      local_20 = &local_80;
      iVar1 = (int)local_98.row - (int)local_80.row;
      if (iVar1 < 1) {
        iVar1 = -iVar1;
      }
      iVar4 = (int)local_98.col - (int)local_80.col;
      if (iVar4 < 1) {
        iVar4 = -iVar4;
      }
      if (0 < iVar1 + iVar4) {
        local_28 = &local_7c;
        local_30 = &local_80;
        iVar1 = (int)local_7c.row - (int)local_80.row;
        if (iVar1 < 1) {
          iVar1 = -iVar1;
        }
        iVar4 = (int)local_7c.col - (int)local_80.col;
        if (iVar4 < 1) {
          iVar4 = -iVar4;
        }
        if (0 < iVar1 + iVar4) {
          puVar3 = get_buf_from_fullmv(in_stack_ffffffffffffff10,
                                       (FULLPEL_MV *)in_stack_ffffffffffffff08);
          local_78 = (**(code **)(*local_38 + 0xc900 + (ulong)local_61 * 0x70))
                               (*(undefined8 *)(local_40 + 0x30),*(undefined4 *)(local_40 + 0x48),
                                puVar3,*(undefined4 *)(local_60 + 0x58));
        }
      }
    }
    pMVar5 = local_70;
    if ((local_74 < local_9c * *local_48 >> 3) && (local_74 < local_78)) {
      *local_48 = local_74;
      MVar2 = get_mv_from_fullmv(&local_7c);
      pMVar5[2] = MVar2;
      clamp_mv((MV *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    }
    if ((local_78 < local_9c * *local_48 >> 3) && (local_78 < local_74)) {
      *local_48 = local_78;
      pMVar5 = local_70;
      MVar2 = get_mv_from_fullmv(&local_80);
      pMVar5[2] = MVar2;
      clamp_mv(pMVar5,in_stack_ffffffffffffff08);
    }
  }
  return;
}

Assistant:

static inline void evaluate_neighbour_mvs(AV1_COMP *cpi, MACROBLOCK *x,
                                          unsigned int *y_sad, bool is_small_sb,
                                          int est_motion) {
  const int source_sad_nonrd = x->content_state_sb.source_sad_nonrd;
  // TODO(yunqingwang@google.com): test if this condition works with other
  // speeds.
  if (est_motion > 2 && source_sad_nonrd > kMedSad) return;

  MACROBLOCKD *xd = &x->e_mbd;
  BLOCK_SIZE bsize = is_small_sb ? BLOCK_64X64 : BLOCK_128X128;
  MB_MODE_INFO *mi = xd->mi[0];

  unsigned int above_y_sad = UINT_MAX;
  unsigned int left_y_sad = UINT_MAX;
  FULLPEL_MV above_mv = kZeroFullMv;
  FULLPEL_MV left_mv = kZeroFullMv;
  SubpelMvLimits subpel_mv_limits;
  const MV dummy_mv = { 0, 0 };
  av1_set_subpel_mv_search_range(&subpel_mv_limits, &x->mv_limits, &dummy_mv);

  // Current best MV
  FULLPEL_MV best_mv = get_fullmv_from_mv(&mi->mv[0].as_mv);
  const int multi = (est_motion > 2 && source_sad_nonrd > kLowSad) ? 7 : 8;

  if (xd->up_available) {
    const MB_MODE_INFO *above_mbmi = xd->above_mbmi;
    if (above_mbmi->mode >= INTRA_MODE_END &&
        above_mbmi->ref_frame[0] == LAST_FRAME) {
      MV temp = above_mbmi->mv[0].as_mv;
      clamp_mv(&temp, &subpel_mv_limits);
      above_mv = get_fullmv_from_mv(&temp);

      if (mv_distance(&best_mv, &above_mv) > 0) {
        uint8_t const *ref_buf =
            get_buf_from_fullmv(&xd->plane[0].pre[0], &above_mv);
        above_y_sad = cpi->ppi->fn_ptr[bsize].sdf(
            x->plane[0].src.buf, x->plane[0].src.stride, ref_buf,
            xd->plane[0].pre[0].stride);
      }
    }
  }
  if (xd->left_available) {
    const MB_MODE_INFO *left_mbmi = xd->left_mbmi;
    if (left_mbmi->mode >= INTRA_MODE_END &&
        left_mbmi->ref_frame[0] == LAST_FRAME) {
      MV temp = left_mbmi->mv[0].as_mv;
      clamp_mv(&temp, &subpel_mv_limits);
      left_mv = get_fullmv_from_mv(&temp);

      if (mv_distance(&best_mv, &left_mv) > 0 &&
          mv_distance(&above_mv, &left_mv) > 0) {
        uint8_t const *ref_buf =
            get_buf_from_fullmv(&xd->plane[0].pre[0], &left_mv);
        left_y_sad = cpi->ppi->fn_ptr[bsize].sdf(
            x->plane[0].src.buf, x->plane[0].src.stride, ref_buf,
            xd->plane[0].pre[0].stride);
      }
    }
  }

  if (above_y_sad < ((multi * *y_sad) >> 3) && above_y_sad < left_y_sad) {
    *y_sad = above_y_sad;
    mi->mv[0].as_mv = get_mv_from_fullmv(&above_mv);
    clamp_mv(&mi->mv[0].as_mv, &subpel_mv_limits);
  }
  if (left_y_sad < ((multi * *y_sad) >> 3) && left_y_sad < above_y_sad) {
    *y_sad = left_y_sad;
    mi->mv[0].as_mv = get_mv_from_fullmv(&left_mv);
    clamp_mv(&mi->mv[0].as_mv, &subpel_mv_limits);
  }
}